

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uint64_t uVar105;
  uint64_t uVar106;
  uint64_t uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined8 uVar110;
  uint64_t mask1;
  ulong *puVar111;
  ulong uVar112;
  ulong uVar113;
  long lVar114;
  ulong uVar115;
  ulong uVar116;
  long lVar117;
  int iVar118;
  uint uVar119;
  ulong *puVar120;
  ulong *puVar121;
  uint uVar122;
  secp256k1_gej *in_R8;
  ulong uVar123;
  ulong uVar124;
  ulong uVar125;
  bool bVar126;
  byte bVar127;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  uint64_t tmp2;
  uint64_t tmp3;
  uint64_t tmp3_1;
  secp256k1_fe Z;
  secp256k1_ge pre_a_lam [8];
  uint64_t tmp1;
  secp256k1_scalar q_lam;
  secp256k1_scalar q_1;
  int wnaf_1 [33];
  secp256k1_ge pre_a [8];
  int wnaf_lam [33];
  uint local_844;
  uint local_840;
  uint local_83c;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  uint64_t local_818;
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  ulong local_7f0;
  int local_7e8;
  ulong local_7e0;
  uint64_t *local_7d8;
  secp256k1_fe *local_7d0;
  secp256k1_fe *local_7c8;
  ulong local_7c0;
  secp256k1_fe local_7b0;
  secp256k1_ge local_788;
  undefined1 auStack_730 [16];
  undefined1 auStack_720 [16];
  uint64_t uStack_710;
  undefined1 auStack_708 [16];
  undefined1 auStack_6f8 [16];
  ulong auStack_6e8 [68];
  undefined1 local_4c8 [32];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  ulong local_458;
  uint local_450;
  secp256k1_scalar local_448;
  secp256k1_scalar local_428;
  uint local_408 [36];
  secp256k1_ge local_378;
  undefined1 auStack_320 [16];
  undefined1 auStack_310 [16];
  uint64_t uStack_300;
  undefined1 auStack_2f8 [16];
  undefined1 auStack_2e8 [16];
  ulong auStack_2d8 [68];
  uint local_b8 [34];
  
  bVar127 = 0;
  if (size < 0x81) {
    local_83c = secp256k1_wnaf_const((int *)local_408,scalar,size,size);
    local_840 = size + 3U >> 2;
    local_844 = 0;
  }
  else {
    iVar118 = size;
    secp256k1_scalar_split_lambda(&local_428,&local_448,scalar);
    local_83c = secp256k1_wnaf_const((int *)local_408,&local_428,0x80,iVar118);
    local_844 = secp256k1_wnaf_const((int *)local_b8,&local_448,0x80,iVar118);
    local_840 = 0x20;
  }
  r->infinity = a->infinity;
  uVar105 = (a->x).n[1];
  uVar106 = (a->x).n[2];
  uVar107 = (a->x).n[3];
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar105;
  (r->x).n[2] = uVar106;
  (r->x).n[3] = uVar107;
  (r->x).n[4] = (a->x).n[4];
  local_7d0 = &r->y;
  uVar105 = (a->y).n[1];
  uVar106 = (a->y).n[2];
  uVar107 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar105;
  (r->y).n[2] = uVar106;
  (r->y).n[3] = uVar107;
  (r->y).n[4] = (a->y).n[4];
  local_7c8 = &r->z;
  (r->z).n[0] = 1;
  local_7d8 = (r->z).n + 1;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  secp256k1_ecmult_odd_multiples_table((int)&local_378,&local_788,&local_7b0,&r->x,in_R8);
  secp256k1_ge_table_set_globalz(8,&local_378,&local_788.x);
  lVar117 = 0x28;
  do {
    secp256k1_fe_normalize_weak((secp256k1_fe *)((long)local_378.x.n + lVar117));
    lVar117 = lVar117 + 0x58;
  } while (lVar117 != 0x2e8);
  if (0x80 < size) {
    lVar117 = 0;
    do {
      puVar111 = (ulong *)((long)local_788.x.n + lVar117);
      puVar120 = (ulong *)((long)local_378.x.n + lVar117);
      puVar121 = puVar111;
      for (lVar114 = 0xb; lVar114 != 0; lVar114 = lVar114 + -1) {
        *puVar121 = *puVar120;
        puVar120 = puVar120 + (ulong)bVar127 * -2 + 1;
        puVar121 = puVar121 + (ulong)bVar127 * -2 + 1;
      }
      uVar116 = *puVar111;
      uVar124 = *(ulong *)((long)local_788.x.n + lVar117 + 8);
      uVar2 = *(ulong *)((long)local_788.x.n + lVar117 + 0x10);
      uVar113 = *(ulong *)((long)local_788.x.n + lVar117 + 0x18);
      uVar3 = *(ulong *)((long)local_788.x.n + lVar117 + 0x20);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar113;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar2;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar124;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar116;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar3;
      uVar112 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar43,0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar112 & 0xfffffffffffff;
      auVar4 = ZEXT816(0x7512f58995c13) * auVar40 + ZEXT816(0x96c28719501ee) * auVar39 +
               ZEXT816(0xc3434e99cf049) * auVar41 + ZEXT816(0x7106e64479ea) * auVar42 +
               auVar4 * ZEXT816(0x1000003d10);
      uVar115 = auVar4._0_8_;
      local_4c8._0_8_ = uVar115 & 0xfffffffffffff;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar115 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar3;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar113;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar2;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar124;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar116;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar112 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar43,8) << 0xc;
      auVar4 = ZEXT816(0x96c28719501ee) * auVar44 + auVar91 + ZEXT816(0x7512f58995c13) * auVar45 +
               ZEXT816(0xc3434e99cf049) * auVar46 + ZEXT816(0x7106e64479ea) * auVar47 +
               ZEXT816(0x7ae96a2b657c) * auVar48 + auVar5 * ZEXT816(0x1000003d10);
      uVar112 = auVar4._0_8_;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar112 >> 0x34 | auVar4._8_8_ << 0xc;
      local_7c0 = (uVar112 & 0xfffffffffffff) >> 0x30;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar116;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar3;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar113;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar2;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar124;
      auVar4 = ZEXT816(0x7512f58995c13) * auVar50 + auVar92 + ZEXT816(0xc3434e99cf049) * auVar51 +
               ZEXT816(0x7106e64479ea) * auVar52 + ZEXT816(0x7ae96a2b657c) * auVar53;
      uVar115 = auVar4._0_8_;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar115 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = (uVar115 & 0xfffffffffffff) << 4 | local_7c0;
      uVar115 = auVar140._0_8_;
      auVar140 = ZEXT816(0x96c28719501ee) * auVar49 + ZEXT816(0x1000003d1) * auVar54;
      *puVar111 = uVar115 & 0xfffffffffffff;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar115 >> 0x34 | auVar140._8_8_ << 0xc;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar124;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar116;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar3;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar113;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar2;
      auVar5 = ZEXT816(0xc3434e99cf049) * auVar57 + auVar94 + ZEXT816(0x7106e64479ea) * auVar58 +
               ZEXT816(0x7ae96a2b657c) * auVar59;
      uVar115 = auVar5._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar115 & 0xfffffffffffff;
      auVar4 = ZEXT816(0x96c28719501ee) * auVar55 + auVar93 + ZEXT816(0x7512f58995c13) * auVar56 +
               auVar6 * ZEXT816(0x1000003d10);
      uVar123 = auVar4._0_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar115 >> 0x34 | auVar5._8_8_ << 0xc;
      *(ulong *)((long)local_788.x.n + lVar117 + 8) = uVar123 & 0xfffffffffffff;
      uVar110 = local_4c8._0_8_;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar123 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar2;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar124;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar116;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar3;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar113;
      auVar5 = ZEXT816(0x7106e64479ea) * auVar63 + auVar96 + ZEXT816(0x7ae96a2b657c) * auVar64;
      uVar116 = auVar5._0_8_;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar116 & 0xfffffffffffff;
      auVar4 = ZEXT816(0x96c28719501ee) * auVar60 + auVar95 + ZEXT816(0x7512f58995c13) * auVar61 +
               ZEXT816(0xc3434e99cf049) * auVar62 + auVar7 * ZEXT816(0x1000003d10);
      uVar124 = auVar4._0_8_;
      *(ulong *)((long)local_788.x.n + lVar117 + 0x10) = uVar124 & 0xfffffffffffff;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = (uVar124 >> 0x34 | auVar4._8_8_ << 0xc) + uVar110;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar116 >> 0x34 | auVar5._8_8_ << 0xc;
      auVar97 = auVar8 * ZEXT816(0x1000003d10) + auVar97;
      uVar116 = auVar97._0_8_;
      *(ulong *)((long)local_788.x.n + lVar117 + 0x18) = uVar116 & 0xfffffffffffff;
      *(ulong *)((long)local_788.x.n + lVar117 + 0x20) =
           (uVar116 >> 0x34 | auVar97._8_8_ << 0xc) + (uVar112 & 0xffffffffffff);
      lVar117 = lVar117 + 0x58;
    } while (lVar117 != 0x2c0);
  }
  uVar116 = (ulong)local_840;
  uVar1 = local_408[uVar116];
  local_838._8_8_ = local_378.x.n[1];
  local_838._0_8_ = local_378.x.n[0];
  local_828._8_8_ = local_378.x.n[3];
  local_828._0_8_ = local_378.x.n[2];
  local_810._8_8_ = local_378.y.n[1];
  local_810._0_8_ = local_378.y.n[0];
  local_800._8_8_ = local_378.y.n[3];
  local_800._0_8_ = local_378.y.n[2];
  uVar119 = -uVar1;
  if (uVar1 != uVar119 && SBORROW4(uVar1,uVar119) == (int)(uVar1 * 2) < 0) {
    uVar119 = uVar1;
  }
  lVar117 = 0;
  local_818 = local_378.x.n[4];
  uVar124 = local_378.y.n[4];
  do {
    bVar126 = (ulong)(uVar119 >> 1) * 0x58 + -0x58 == lVar117;
    uVar122 = (uint)bVar126;
    auVar140._0_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
    auVar140._4_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
    auVar140._8_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
    auVar140._12_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
    local_838 = *(undefined1 (*) [16])(auStack_320 + lVar117) & auVar140 | ~auVar140 & local_838;
    local_828 = *(undefined1 (*) [16])(auStack_310 + lVar117) & auVar140 | ~auVar140 & local_828;
    if (bVar126) {
      local_818 = *(uint64_t *)((long)&uStack_300 + lVar117);
    }
    local_810 = *(undefined1 (*) [16])(auStack_2f8 + lVar117) & auVar140 | ~auVar140 & local_810;
    if (bVar126) {
      uVar124 = *(ulong *)((long)auStack_2d8 + lVar117);
    }
    local_800 = ~auVar140 & local_800 | *(undefined1 (*) [16])(auStack_2e8 + lVar117) & auVar140;
    lVar117 = lVar117 + 0x58;
  } while (lVar117 != 0x268);
  uVar2 = (ulong)(uVar1 >> 0x1f) - 1;
  uVar113 = -(ulong)(uVar1 >> 0x1f);
  local_7f0 = 0x3fffffffffffc - uVar124 & uVar113 | uVar124 & uVar2;
  local_7e8 = 0;
  auVar132._0_8_ = 0x3ffffbfffff0bc - local_810._0_8_;
  auVar132._8_8_ = 0x3ffffffffffffc - local_810._8_8_;
  auVar136._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
  auVar136._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
  auVar141._8_4_ = (int)uVar2;
  auVar141._0_8_ = uVar2;
  auVar141._12_4_ = (int)(uVar2 >> 0x20);
  auVar148._8_4_ = (int)uVar113;
  auVar148._0_8_ = uVar113;
  auVar148._12_4_ = (int)(uVar113 >> 0x20);
  local_810 = auVar132 & auVar148 | local_810 & auVar141;
  local_800 = auVar136 & auVar148 | local_800 & auVar141;
  r->infinity = 0;
  (r->x).n[4] = local_818;
  (r->x).n[2] = local_828._0_8_;
  (r->x).n[3] = local_828._8_8_;
  (r->x).n[0] = local_838._0_8_;
  (r->x).n[1] = local_838._8_8_;
  *(undefined1 (*) [16])(local_7d0->n + 2) = local_800;
  local_7d0->n[4] = local_7f0;
  local_7d0->n[0] = local_810._0_8_;
  local_7d0->n[1] = local_810._8_8_;
  (r->z).n[0] = 1;
  local_7d8[2] = 0;
  local_7d8[3] = 0;
  local_7d8[0] = 0;
  local_7d8[1] = 0;
  local_7e0 = (ulong)(uint)size;
  if (0x80 < size) {
    uVar1 = local_b8[uVar116];
    local_838._8_8_ = local_788.x.n[1];
    local_838._0_8_ = local_788.x.n[0];
    local_828._8_8_ = local_788.x.n[3];
    local_828._0_8_ = local_788.x.n[2];
    local_800._8_8_ = local_788.y.n[3];
    local_800._0_8_ = local_788.y.n[2];
    local_810._8_8_ = local_788.y.n[1];
    local_810._0_8_ = local_788.y.n[0];
    uVar119 = -uVar1;
    if (uVar1 != uVar119 && SBORROW4(uVar1,uVar119) == (int)(uVar1 * 2) < 0) {
      uVar119 = uVar1;
    }
    lVar117 = 0;
    uVar124 = local_788.y.n[4];
    local_818 = local_788.x.n[4];
    do {
      bVar126 = (ulong)(uVar119 >> 1) * 0x58 + -0x58 == lVar117;
      uVar122 = (uint)bVar126;
      auVar142._0_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
      auVar142._4_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
      auVar142._8_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
      auVar142._12_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
      local_838 = *(undefined1 (*) [16])(auStack_730 + lVar117) & auVar142 | ~auVar142 & local_838;
      local_828 = *(undefined1 (*) [16])(auStack_720 + lVar117) & auVar142 | ~auVar142 & local_828;
      if (bVar126) {
        local_818 = *(uint64_t *)((long)&uStack_710 + lVar117);
      }
      local_810 = *(undefined1 (*) [16])(auStack_708 + lVar117) & auVar142 | ~auVar142 & local_810;
      if (bVar126) {
        uVar124 = *(ulong *)((long)auStack_6e8 + lVar117);
      }
      local_800 = ~auVar142 & local_800 | *(undefined1 (*) [16])(auStack_6f8 + lVar117) & auVar142;
      lVar117 = lVar117 + 0x58;
    } while (lVar117 != 0x268);
    local_7e8 = 0;
    auVar133._0_8_ = 0x3ffffbfffff0bc - local_810._0_8_;
    auVar133._8_8_ = 0x3ffffffffffffc - local_810._8_8_;
    auVar137._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
    auVar137._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
    uVar2 = (ulong)(uVar1 >> 0x1f) - 1;
    uVar113 = -(ulong)(uVar1 >> 0x1f);
    auVar143._8_4_ = (int)uVar2;
    auVar143._0_8_ = uVar2;
    auVar143._12_4_ = (int)(uVar2 >> 0x20);
    auVar149._8_4_ = (int)uVar113;
    auVar149._0_8_ = uVar113;
    auVar149._12_4_ = (int)(uVar113 >> 0x20);
    local_810 = auVar133 & auVar149 | local_810 & auVar143;
    local_800 = auVar137 & auVar149 | local_800 & auVar143;
    local_7f0 = uVar113 & 0x3fffffffffffc - uVar124 | uVar124 & uVar2;
    secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_838);
  }
  if (local_840 != 0) {
    do {
      iVar118 = 4;
      do {
        secp256k1_gej_double(r,r);
        iVar118 = iVar118 + -1;
      } while (iVar118 != 0);
      uVar1 = local_408[uVar116 - 1];
      local_828._8_8_ = local_378.x.n[3];
      local_828._0_8_ = local_378.x.n[2];
      local_838._8_8_ = local_378.x.n[1];
      local_838._0_8_ = local_378.x.n[0];
      local_800._8_8_ = local_378.y.n[3];
      local_800._0_8_ = local_378.y.n[2];
      local_810._8_8_ = local_378.y.n[1];
      local_810._0_8_ = local_378.y.n[0];
      uVar119 = -uVar1;
      if (uVar1 != uVar119 && SBORROW4(uVar1,uVar119) == (int)(uVar1 * 2) < 0) {
        uVar119 = uVar1;
      }
      lVar117 = 0;
      uVar124 = local_378.y.n[4];
      local_818 = local_378.x.n[4];
      do {
        bVar126 = (ulong)(uVar119 >> 1) * 0x58 + -0x58 == lVar117;
        uVar122 = (uint)bVar126;
        auVar144._0_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
        auVar144._4_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
        auVar144._8_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
        auVar144._12_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
        local_838 = *(undefined1 (*) [16])(auStack_320 + lVar117) & auVar144 | ~auVar144 & local_838
        ;
        local_828 = *(undefined1 (*) [16])(auStack_310 + lVar117) & auVar144 | ~auVar144 & local_828
        ;
        if (bVar126) {
          local_818 = *(uint64_t *)((long)&uStack_300 + lVar117);
        }
        local_810 = *(undefined1 (*) [16])(auStack_2f8 + lVar117) & auVar144 | ~auVar144 & local_810
        ;
        if (bVar126) {
          uVar124 = *(ulong *)((long)auStack_2d8 + lVar117);
        }
        local_800 = ~auVar144 & local_800 | *(undefined1 (*) [16])(auStack_2e8 + lVar117) & auVar144
        ;
        lVar117 = lVar117 + 0x58;
      } while (lVar117 != 0x268);
      local_7e8 = 0;
      auVar134._0_8_ = 0x3ffffbfffff0bc - local_810._0_8_;
      auVar134._8_8_ = 0x3ffffffffffffc - local_810._8_8_;
      auVar138._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
      auVar138._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
      uVar2 = (ulong)(uVar1 >> 0x1f) - 1;
      uVar113 = -(ulong)(uVar1 >> 0x1f);
      auVar145._8_4_ = (int)uVar2;
      auVar145._0_8_ = uVar2;
      auVar145._12_4_ = (int)(uVar2 >> 0x20);
      auVar150._8_4_ = (int)uVar113;
      auVar150._0_8_ = uVar113;
      auVar150._12_4_ = (int)(uVar113 >> 0x20);
      local_810 = auVar134 & auVar150 | local_810 & auVar145;
      local_800 = auVar138 & auVar150 | local_800 & auVar145;
      local_7f0 = uVar113 & 0x3fffffffffffc - uVar124 | uVar124 & uVar2;
      secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_838);
      size = (int)local_7e0;
      if (0x80 < size) {
        uVar1 = local_b8[uVar116 - 1];
        local_828._8_8_ = local_788.x.n[3];
        local_828._0_8_ = local_788.x.n[2];
        local_838._8_8_ = local_788.x.n[1];
        local_838._0_8_ = local_788.x.n[0];
        local_800._8_8_ = local_788.y.n[3];
        local_800._0_8_ = local_788.y.n[2];
        local_810._8_8_ = local_788.y.n[1];
        local_810._0_8_ = local_788.y.n[0];
        uVar119 = -uVar1;
        if (uVar1 != uVar119 && SBORROW4(uVar1,uVar119) == (int)(uVar1 * 2) < 0) {
          uVar119 = uVar1;
        }
        lVar117 = 0;
        uVar124 = local_788.y.n[4];
        local_818 = local_788.x.n[4];
        do {
          bVar126 = (ulong)(uVar119 >> 1) * 0x58 + -0x58 == lVar117;
          uVar122 = (uint)bVar126;
          auVar146._0_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
          auVar146._4_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
          auVar146._8_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
          auVar146._12_4_ = (int)(uVar122 << 0x1f) >> 0x1f;
          local_838 = *(undefined1 (*) [16])(auStack_730 + lVar117) & auVar146 |
                      ~auVar146 & local_838;
          local_828 = *(undefined1 (*) [16])(auStack_720 + lVar117) & auVar146 |
                      ~auVar146 & local_828;
          if (bVar126) {
            local_818 = *(uint64_t *)((long)&uStack_710 + lVar117);
          }
          local_810 = *(undefined1 (*) [16])(auStack_708 + lVar117) & auVar146 |
                      ~auVar146 & local_810;
          if (bVar126) {
            uVar124 = *(ulong *)((long)auStack_6e8 + lVar117);
          }
          local_800 = ~auVar146 & local_800 |
                      *(undefined1 (*) [16])(auStack_6f8 + lVar117) & auVar146;
          lVar117 = lVar117 + 0x58;
        } while (lVar117 != 0x268);
        local_7e8 = 0;
        auVar135._0_8_ = 0x3ffffbfffff0bc - local_810._0_8_;
        auVar135._8_8_ = 0x3ffffffffffffc - local_810._8_8_;
        auVar139._0_8_ = 0x3ffffffffffffc - local_800._0_8_;
        auVar139._8_8_ = 0x3ffffffffffffc - local_800._8_8_;
        uVar2 = (ulong)(uVar1 >> 0x1f) - 1;
        uVar113 = -(ulong)(uVar1 >> 0x1f);
        auVar147._8_4_ = (int)uVar2;
        auVar147._0_8_ = uVar2;
        auVar147._12_4_ = (int)(uVar2 >> 0x20);
        auVar151._8_4_ = (int)uVar113;
        auVar151._0_8_ = uVar113;
        auVar151._12_4_ = (int)(uVar113 >> 0x20);
        local_810 = auVar135 & auVar151 | local_810 & auVar147;
        local_800 = auVar139 & auVar151 | local_800 & auVar147;
        local_7f0 = uVar113 & 0x3fffffffffffc - uVar124 | uVar124 & uVar2;
        secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_838);
      }
      bVar126 = 1 < (long)uVar116;
      uVar116 = uVar116 - 1;
    } while (bVar126);
  }
  secp256k1_ge_neg((secp256k1_ge *)local_838,&local_378);
  secp256k1_gej_add_ge((secp256k1_gej *)local_4c8,r,(secp256k1_ge *)local_838);
  uVar116 = (ulong)local_83c - 1;
  uVar124 = -(ulong)local_83c;
  auVar128._8_4_ = (int)uVar116;
  auVar128._0_8_ = uVar116;
  auVar128._12_4_ = (int)(uVar116 >> 0x20);
  auVar140 = *(undefined1 (*) [16])((r->x).n + 2);
  auVar4 = *(undefined1 (*) [16])((r->x).n + 4);
  auVar5 = *(undefined1 (*) [16])((r->y).n + 1);
  auVar130._8_4_ = (int)uVar124;
  auVar130._0_8_ = uVar124;
  auVar130._12_4_ = (int)(uVar124 >> 0x20);
  auVar108._8_8_ = local_4c8._8_8_;
  auVar108._0_8_ = local_4c8._0_8_;
  *(undefined1 (*) [16])(r->x).n = auVar108 & auVar130 | *(undefined1 (*) [16])(r->x).n & auVar128;
  *(undefined1 (*) [16])((r->x).n + 2) = local_4c8._16_16_ & auVar130 | auVar140 & auVar128;
  *(undefined1 (*) [16])((r->x).n + 4) = local_4a8 & auVar130 | auVar4 & auVar128;
  *(undefined1 (*) [16])((r->y).n + 1) = local_498 & auVar130 | auVar5 & auVar128;
  *(undefined1 (*) [16])((r->y).n + 3) =
       local_488 & auVar130 | *(undefined1 (*) [16])((r->y).n + 3) & auVar128;
  *(undefined1 (*) [16])(r->z).n = local_478 & auVar130 | *(undefined1 (*) [16])(r->z).n & auVar128;
  *(undefined1 (*) [16])((r->z).n + 2) =
       auVar130 & local_468 | *(undefined1 (*) [16])((r->z).n + 2) & auVar128;
  (r->z).n[4] = uVar124 & local_458 | uVar116 & (r->z).n[4];
  r->infinity = (local_450 ^ r->infinity) & local_83c ^ r->infinity;
  if (0x80 < size) {
    secp256k1_ge_neg((secp256k1_ge *)local_838,&local_788);
    secp256k1_gej_add_ge((secp256k1_gej *)local_4c8,r,(secp256k1_ge *)local_838);
    uVar116 = (ulong)local_844 - 1;
    uVar124 = -(ulong)local_844;
    auVar129._8_4_ = (int)uVar116;
    auVar129._0_8_ = uVar116;
    auVar129._12_4_ = (int)(uVar116 >> 0x20);
    auVar140 = *(undefined1 (*) [16])((r->x).n + 2);
    auVar4 = *(undefined1 (*) [16])((r->x).n + 4);
    auVar5 = *(undefined1 (*) [16])((r->y).n + 1);
    auVar131._8_4_ = (int)uVar124;
    auVar131._0_8_ = uVar124;
    auVar131._12_4_ = (int)(uVar124 >> 0x20);
    auVar109._8_8_ = local_4c8._8_8_;
    auVar109._0_8_ = local_4c8._0_8_;
    *(undefined1 (*) [16])(r->x).n = auVar109 & auVar131 | *(undefined1 (*) [16])(r->x).n & auVar129
    ;
    *(undefined1 (*) [16])((r->x).n + 2) = local_4c8._16_16_ & auVar131 | auVar140 & auVar129;
    *(undefined1 (*) [16])((r->x).n + 4) = local_4a8 & auVar131 | auVar4 & auVar129;
    *(undefined1 (*) [16])((r->y).n + 1) = local_498 & auVar131 | auVar5 & auVar129;
    *(undefined1 (*) [16])((r->y).n + 3) =
         local_488 & auVar131 | *(undefined1 (*) [16])((r->y).n + 3) & auVar129;
    *(undefined1 (*) [16])(r->z).n =
         local_478 & auVar131 | *(undefined1 (*) [16])(r->z).n & auVar129;
    *(undefined1 (*) [16])((r->z).n + 2) =
         auVar131 & local_468 | *(undefined1 (*) [16])((r->z).n + 2) & auVar129;
    (r->z).n[4] = uVar124 & local_458 | uVar116 & (r->z).n[4];
    r->infinity = (local_450 ^ r->infinity) & local_844 ^ r->infinity;
  }
  uVar116 = local_7c8->n[0];
  uVar124 = local_7c8->n[1];
  uVar2 = local_7c8->n[2];
  uVar113 = local_7c8->n[3];
  uVar3 = local_7c8->n[4];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_7b0.n[0];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar113;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_7b0.n[1];
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_7b0.n[2];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar124;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_7b0.n[3];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar116;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_7b0.n[4];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar3;
  uVar112 = SUB168(auVar13 * auVar69,0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar112 & 0xfffffffffffff;
  auVar140 = auVar10 * auVar66 + auVar9 * auVar65 + auVar11 * auVar67 + auVar12 * auVar68 +
             auVar14 * ZEXT816(0x1000003d10);
  uVar115 = auVar140._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar115 >> 0x34 | auVar140._8_8_ << 0xc;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_7b0.n[0];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar3;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_7b0.n[1];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar113;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_7b0.n[2];
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_7b0.n[3];
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar124;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_7b0.n[4];
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar116;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar112 >> 0x34 | SUB168(auVar13 * auVar69,8) << 0xc;
  auVar140 = auVar15 * auVar70 + auVar98 + auVar16 * auVar71 + auVar17 * auVar72 + auVar18 * auVar73
             + auVar19 * auVar74 + auVar20 * ZEXT816(0x1000003d10);
  uVar112 = auVar140._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar112 >> 0x34 | auVar140._8_8_ << 0xc;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_7b0.n[0];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar116;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_7b0.n[1];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar3;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_7b0.n[2];
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar113;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_7b0.n[3];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_7b0.n[4];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar124;
  auVar140 = auVar22 * auVar76 + auVar99 + auVar23 * auVar77 + auVar24 * auVar78 + auVar25 * auVar79
  ;
  uVar123 = auVar140._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar123 >> 0x34 | auVar140._8_8_ << 0xc;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = (uVar123 & 0xfffffffffffff) << 4 | (uVar112 & 0xfffffffffffff) >> 0x30;
  auVar140 = auVar21 * auVar75 + ZEXT816(0x1000003d1) * auVar80;
  uVar123 = auVar140._0_8_;
  local_7c8->n[0] = uVar123 & 0xfffffffffffff;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar123 >> 0x34 | auVar140._8_8_ << 0xc;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_7b0.n[0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar124;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_7b0.n[1];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar116;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_7b0.n[2];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_7b0.n[3];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar113;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_7b0.n[4];
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar2;
  auVar4 = auVar28 * auVar83 + auVar101 + auVar29 * auVar84 + auVar30 * auVar85;
  uVar123 = auVar4._0_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar123 & 0xfffffffffffff;
  auVar140 = auVar26 * auVar81 + auVar100 + auVar27 * auVar82 + auVar31 * ZEXT816(0x1000003d10);
  uVar125 = auVar140._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar123 >> 0x34 | auVar4._8_8_ << 0xc;
  local_7c8->n[1] = uVar125 & 0xfffffffffffff;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar125 >> 0x34 | auVar140._8_8_ << 0xc;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_7b0.n[0];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_7b0.n[1];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar124;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_7b0.n[2];
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar116;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_7b0.n[3];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar3;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_7b0.n[4];
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar113;
  auVar4 = auVar35 * auVar89 + auVar103 + auVar36 * auVar90;
  uVar116 = auVar4._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar116 & 0xfffffffffffff;
  auVar140 = auVar32 * auVar86 + auVar102 + auVar33 * auVar87 + auVar34 * auVar88 +
             auVar37 * ZEXT816(0x1000003d10);
  uVar124 = auVar140._0_8_;
  local_7c8->n[2] = uVar124 & 0xfffffffffffff;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = (uVar124 >> 0x34 | auVar140._8_8_ << 0xc) + (uVar115 & 0xfffffffffffff);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar116 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar104 = auVar38 * ZEXT816(0x1000003d10) + auVar104;
  uVar116 = auVar104._0_8_;
  local_7c8->n[3] = uVar116 & 0xfffffffffffff;
  local_7c8->n[4] = (uVar116 >> 0x34 | auVar104._8_8_ << 0xc) + (uVar112 & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;

    /* build wnaf representation for q. */
    int rsize = size;
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, scalar);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   &q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, &q_lam, WINDOW_A - 1, 128);
    } else
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, scalar, WINDOW_A - 1, size);
        skew_lam = 0;
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    VERIFY_CHECK(!a->infinity);
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }

    }

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double(r, r);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
    }

    {
        /* Correct for wNAF skew */
        secp256k1_gej tmpj;

        secp256k1_ge_neg(&tmpa, &pre_a[0]);
        secp256k1_gej_add_ge(&tmpj, r, &tmpa);
        secp256k1_gej_cmov(r, &tmpj, skew_1);

        if (size > 128) {
            secp256k1_ge_neg(&tmpa, &pre_a_lam[0]);
            secp256k1_gej_add_ge(&tmpj, r, &tmpa);
            secp256k1_gej_cmov(r, &tmpj, skew_lam);
        }
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);
}